

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTarget.cxx
# Opt level: O0

void __thiscall cmTarget::GetTllSignatureTraces(cmTarget *this,ostringstream *s,TLLSignature sig)

{
  Snapshot snapshot;
  bool bVar1;
  char *pcVar2;
  ostream *poVar3;
  cmMakefile *this_00;
  pointer ppVar4;
  string local_d8;
  undefined1 local_b8 [8];
  cmListFileContext lfc;
  __normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
  local_68;
  const_iterator it;
  cmLinkedTree<cmState::SnapshotDataType> *local_58;
  PositionType local_50;
  undefined1 local_48 [8];
  cmOutputConverter converter;
  char *sigString;
  TLLSignature sig_local;
  ostringstream *s_local;
  cmTarget *this_local;
  
  pcVar2 = "plain";
  if (sig == KeywordTLLSignature) {
    pcVar2 = "keyword";
  }
  converter._24_8_ = pcVar2;
  poVar3 = std::operator<<((ostream *)s,"The uses of the ");
  poVar3 = std::operator<<(poVar3,(char *)converter._24_8_);
  std::operator<<(poVar3," signature are here:\n");
  this_00 = GetMakefile(this);
  cmMakefile::GetStateSnapshot((Snapshot *)&it,this_00);
  snapshot.Position.Tree = local_58;
  snapshot.State = (cmState *)it._M_current;
  snapshot.Position.Position = local_50;
  cmOutputConverter::cmOutputConverter((cmOutputConverter *)local_48,snapshot);
  local_68._M_current =
       (pair<cmTarget::TLLSignature,_cmListFileContext> *)
       std::
       vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
       ::begin(&this->TLLCommands);
  while( true ) {
    lfc.Line = (long)std::
                     vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>
                     ::end(&this->TLLCommands);
    bVar1 = __gnu_cxx::operator!=
                      (&local_68,
                       (__normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
                        *)&lfc.Line);
    if (!bVar1) break;
    ppVar4 = __gnu_cxx::
             __normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
             ::operator->(&local_68);
    if (ppVar4->first == sig) {
      ppVar4 = __gnu_cxx::
               __normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
               ::operator->(&local_68);
      cmListFileContext::cmListFileContext((cmListFileContext *)local_b8,&ppVar4->second);
      cmOutputConverter::Convert
                (&local_d8,(cmOutputConverter *)local_48,(string *)((long)&lfc.Name.field_2 + 8),
                 HOME,UNCHANGED);
      std::__cxx11::string::operator=
                ((string *)(lfc.Name.field_2._M_local_buf + 8),(string *)&local_d8);
      std::__cxx11::string::~string((string *)&local_d8);
      poVar3 = std::operator<<((ostream *)s," * ");
      poVar3 = ::operator<<(poVar3,(cmListFileContext *)local_b8);
      std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      cmListFileContext::~cmListFileContext((cmListFileContext *)local_b8);
    }
    __gnu_cxx::
    __normal_iterator<const_std::pair<cmTarget::TLLSignature,_cmListFileContext>_*,_std::vector<std::pair<cmTarget::TLLSignature,_cmListFileContext>,_std::allocator<std::pair<cmTarget::TLLSignature,_cmListFileContext>_>_>_>
    ::operator++(&local_68);
  }
  return;
}

Assistant:

void cmTarget::GetTllSignatureTraces(std::ostringstream &s,
                                     TLLSignature sig) const
{
  const char *sigString = (sig == cmTarget::KeywordTLLSignature ? "keyword"
                                                                : "plain");
  s << "The uses of the " << sigString << " signature are here:\n";
  typedef std::vector<std::pair<TLLSignature, cmListFileContext> > Container;
  cmOutputConverter converter(this->GetMakefile()->GetStateSnapshot());
  for(Container::const_iterator it = this->TLLCommands.begin();
      it != this->TLLCommands.end(); ++it)
    {
    if (it->first == sig)
      {
      cmListFileContext lfc = it->second;
      lfc.FilePath = converter.Convert(lfc.FilePath, cmOutputConverter::HOME);
      s << " * " << lfc << std::endl;
      }
    }
}